

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O0

uint64_t pac_mult(uint64_t i)

{
  int cell;
  int cell_00;
  int cell_01;
  int cell_02;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint64_t uVar13;
  byte bVar14;
  int t3;
  int t2;
  int t1;
  int t0;
  int ic;
  int i8;
  int i4;
  int i0;
  int b;
  uint64_t o;
  uint64_t i_local;
  
  _i0 = 0;
  for (i4 = 0; i4 < 0x10; i4 = i4 + 4) {
    uVar13 = extract64(i,i4,4);
    cell = (int)uVar13;
    uVar13 = extract64(i,i4 + 0x10,4);
    cell_00 = (int)uVar13;
    uVar13 = extract64(i,i4 + 0x20,4);
    cell_01 = (int)uVar13;
    uVar13 = extract64(i,i4 + 0x30,4);
    cell_02 = (int)uVar13;
    uVar1 = rot_cell(cell_01,1);
    uVar2 = rot_cell(cell_00,2);
    uVar3 = rot_cell(cell,1);
    uVar4 = rot_cell(cell_02,1);
    uVar5 = rot_cell(cell_00,1);
    uVar6 = rot_cell(cell,2);
    uVar7 = rot_cell(cell_02,2);
    uVar8 = rot_cell(cell_01,1);
    uVar9 = rot_cell(cell,1);
    uVar10 = rot_cell(cell_02,1);
    uVar11 = rot_cell(cell_01,2);
    uVar12 = rot_cell(cell_00,1);
    bVar14 = (byte)i4;
    _i0 = (long)(int)(uVar1 ^ uVar2 ^ uVar3) << (bVar14 + 0x30 & 0x3f) |
          (long)(int)(uVar4 ^ uVar5 ^ uVar6) << (bVar14 + 0x20 & 0x3f) |
          (long)(int)(uVar7 ^ uVar8 ^ uVar9) << (bVar14 + 0x10 & 0x3f) |
          (long)(int)(uVar10 ^ uVar11 ^ uVar12) << (bVar14 & 0x3f) | _i0;
  }
  return _i0;
}

Assistant:

static uint64_t pac_mult(uint64_t i)
{
    uint64_t o = 0;
    int b;

    for (b = 0; b < 4 * 4; b += 4) {
        int i0, i4, i8, ic, t0, t1, t2, t3;

        i0 = extract64(i, b, 4);
        i4 = extract64(i, b + 4 * 4, 4);
        i8 = extract64(i, b + 8 * 4, 4);
        ic = extract64(i, b + 12 * 4, 4);

        t0 = rot_cell(i8, 1) ^ rot_cell(i4, 2) ^ rot_cell(i0, 1);
        t1 = rot_cell(ic, 1) ^ rot_cell(i4, 1) ^ rot_cell(i0, 2);
        t2 = rot_cell(ic, 2) ^ rot_cell(i8, 1) ^ rot_cell(i0, 1);
        t3 = rot_cell(ic, 1) ^ rot_cell(i8, 2) ^ rot_cell(i4, 1);

        o |= (uint64_t)t3 << b;
        o |= (uint64_t)t2 << (b + 4 * 4);
        o |= (uint64_t)t1 << (b + 8 * 4);
        o |= (uint64_t)t0 << (b + 12 * 4);
    }
    return o;
}